

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlReporter::test_run_start(XmlReporter *this)

{
  char *pcVar1;
  string *name;
  long in_RDI;
  string binary_name;
  string *in_stack_fffffffffffffcb8;
  XmlWriter *in_stack_fffffffffffffcc0;
  allocator *this_00;
  string *in_stack_fffffffffffffcc8;
  ScopedElement *in_stack_fffffffffffffcd0;
  allocator *paVar2;
  string *in_stack_fffffffffffffce0;
  XmlWriter *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  XmlWriter *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  XmlWriter *in_stack_fffffffffffffd50;
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  char *local_118;
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [47];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  String::c_str((String *)0x11ca8c);
  pcVar1 = skipPathFromFilename((char *)in_stack_fffffffffffffcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,pcVar1,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"doctest",&local_61);
  XmlWriter::startElement(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"binary",&local_89);
  XmlWriter::writeAttribute
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if ((*(byte *)(*(long *)(in_RDI + 0x78) + 0x7b) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"version",&local_b1);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"Options",&local_e1);
  XmlWriter::scopedElement(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  paVar2 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"order_by",paVar2);
  local_118 = String::c_str((String *)0x11ce16);
  (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(char **)in_stack_fffffffffffffcc0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"rand_seed",&local_139);
  XmlWriter::ScopedElement::writeAttribute<unsigned_int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(uint *)in_stack_fffffffffffffcc0);
  paVar2 = &local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"first",paVar2);
  XmlWriter::ScopedElement::writeAttribute<unsigned_int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(uint *)in_stack_fffffffffffffcc0);
  paVar2 = &local_189;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"last",paVar2);
  XmlWriter::ScopedElement::writeAttribute<unsigned_int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(uint *)in_stack_fffffffffffffcc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"abort_after",&local_1b1);
  XmlWriter::ScopedElement::writeAttribute<int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(int *)in_stack_fffffffffffffcc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"subcase_filter_levels",&local_1d9);
  XmlWriter::ScopedElement::writeAttribute<int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(int *)in_stack_fffffffffffffcc0);
  paVar2 = &local_201;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"case_sensitive",paVar2);
  XmlWriter::ScopedElement::writeAttribute<bool>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
             &in_stack_fffffffffffffcc0->m_tagIsOpen);
  paVar2 = &local_229;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"no_throw",paVar2);
  name = (string *)
         XmlWriter::ScopedElement::writeAttribute<bool>
                   ((ScopedElement *)paVar2,in_stack_fffffffffffffcc8,
                    &in_stack_fffffffffffffcc0->m_tagIsOpen);
  this_00 = &local_251;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"no_skip",this_00);
  XmlWriter::ScopedElement::writeAttribute<bool>((ScopedElement *)paVar2,name,(bool *)this_00);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_00);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void test_run_start() override {
            // remove .exe extension - mainly to have the same output on UNIX and Windows
            std::string binary_name = skipPathFromFilename(opt.binary_name.c_str());
#ifdef DOCTEST_PLATFORM_WINDOWS
            if(binary_name.rfind(".exe") != std::string::npos)
                binary_name = binary_name.substr(0, binary_name.length() - 4);
#endif // DOCTEST_PLATFORM_WINDOWS

            xml.startElement("doctest").writeAttribute("binary", binary_name);
            if(opt.no_version == false)
                xml.writeAttribute("version", DOCTEST_VERSION_STR);

            // only the consequential ones (TODO: filters)
            xml.scopedElement("Options")
                    .writeAttribute("order_by", opt.order_by.c_str())
                    .writeAttribute("rand_seed", opt.rand_seed)
                    .writeAttribute("first", opt.first)
                    .writeAttribute("last", opt.last)
                    .writeAttribute("abort_after", opt.abort_after)
                    .writeAttribute("subcase_filter_levels", opt.subcase_filter_levels)
                    .writeAttribute("case_sensitive", opt.case_sensitive)
                    .writeAttribute("no_throw", opt.no_throw)
                    .writeAttribute("no_skip", opt.no_skip);
        }